

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

config_value * config_value_create_boolean(_Bool boolean)

{
  config_value *pcVar1;
  
  pcVar1 = (config_value *)malloc(0x10);
  if (pcVar1 != (config_value *)0x0) {
    pcVar1->type = BOOLEAN;
    (pcVar1->data).boolean = boolean;
  }
  return pcVar1;
}

Assistant:

struct config_value *config_value_create_boolean(bool boolean)
{
        struct config_value *value = malloc(sizeof(struct config_value));

        if (value == NULL) {
                return NULL;
        }

        value->type = BOOLEAN;
        value->data.boolean = boolean;

        return value;
}